

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_gzip_recursive.c
# Opt level: O0

void test_read_filter_gzip_recursive(void)

{
  wchar_t wVar1;
  int iVar2;
  archive_conflict *a_00;
  char *v1;
  archive *a;
  char *name;
  
  wVar1 = canGzip();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                   ,L'!');
    test_skipping("gzip not available");
  }
  else {
    a_00 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                     ,L'%',(uint)(a_00 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar2 = archive_read_support_filter_all((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'&',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",a_00);
    iVar2 = archive_read_support_format_all((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'\'',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",a_00)
    ;
    extract_reference_file("test_read_filter_gzip_recursive.gz");
    wVar1 = archive_read_open_filename(a_00,"test_read_filter_gzip_recursive.gz",200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'*',-0x1e,"ARCHIVE_FATAL",(long)wVar1,
                        "archive_read_open_filename(a, name, 200)",a_00);
    iVar2 = archive_filter_code((archive *)a_00,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'-',(long)iVar2,"archive_filter_code(a, 0)",1,"ARCHIVE_FILTER_GZIP",
                        (void *)0x0);
    v1 = archive_filter_name((archive *)a_00,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
               ,L'.',v1,"archive_filter_name(a, 0)","gzip","\"gzip\"",(void *)0x0,L'\0');
    iVar2 = archive_read_close((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'0',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",(void *)0x0);
    iVar2 = archive_read_free((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_filter_gzip_recursive.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_gzip_recursive)
{
	const char *name = "test_read_filter_gzip_recursive.gz";
	struct archive *a;

	if (!canGzip()) {
		skipping("gzip not available");
		return;
	}

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_filename(a, name, 200));

	/* Verify that the filter detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_GZIP);
	assertEqualString(archive_filter_name(a, 0), "gzip");

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}